

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O2

_Bool plutovg_surface_write_to_jpg(plutovg_surface_t *surface,char *filename,int quality)

{
  int height;
  uchar *puVar1;
  int iVar2;
  FILE *__stream;
  int in_R9D;
  _Bool _Var3;
  stbi__write_context local_88;
  
  plutovg_surface_write_begin(surface);
  iVar2 = surface->width;
  height = surface->height;
  puVar1 = surface->data;
  local_88.buffer[0x30] = '\0';
  local_88.buffer[0x31] = '\0';
  local_88.buffer[0x32] = '\0';
  local_88.buffer[0x33] = '\0';
  local_88.buffer[0x34] = '\0';
  local_88.buffer[0x35] = '\0';
  local_88.buffer[0x36] = '\0';
  local_88.buffer[0x37] = '\0';
  local_88.buffer[0x38] = '\0';
  local_88.buffer[0x39] = '\0';
  local_88.buffer[0x3a] = '\0';
  local_88.buffer[0x3b] = '\0';
  local_88.buffer[0x3c] = '\0';
  local_88.buffer[0x3d] = '\0';
  local_88.buffer[0x3e] = '\0';
  local_88.buffer[0x3f] = '\0';
  local_88.buffer[0x20] = '\0';
  local_88.buffer[0x21] = '\0';
  local_88.buffer[0x22] = '\0';
  local_88.buffer[0x23] = '\0';
  local_88.buffer[0x24] = '\0';
  local_88.buffer[0x25] = '\0';
  local_88.buffer[0x26] = '\0';
  local_88.buffer[0x27] = '\0';
  local_88.buffer[0x28] = '\0';
  local_88.buffer[0x29] = '\0';
  local_88.buffer[0x2a] = '\0';
  local_88.buffer[0x2b] = '\0';
  local_88.buffer[0x2c] = '\0';
  local_88.buffer[0x2d] = '\0';
  local_88.buffer[0x2e] = '\0';
  local_88.buffer[0x2f] = '\0';
  local_88.buffer[0x10] = '\0';
  local_88.buffer[0x11] = '\0';
  local_88.buffer[0x12] = '\0';
  local_88.buffer[0x13] = '\0';
  local_88.buffer[0x14] = '\0';
  local_88.buffer[0x15] = '\0';
  local_88.buffer[0x16] = '\0';
  local_88.buffer[0x17] = '\0';
  local_88.buffer[0x18] = '\0';
  local_88.buffer[0x19] = '\0';
  local_88.buffer[0x1a] = '\0';
  local_88.buffer[0x1b] = '\0';
  local_88.buffer[0x1c] = '\0';
  local_88.buffer[0x1d] = '\0';
  local_88.buffer[0x1e] = '\0';
  local_88.buffer[0x1f] = '\0';
  local_88.buffer[0] = '\0';
  local_88.buffer[1] = '\0';
  local_88.buffer[2] = '\0';
  local_88.buffer[3] = '\0';
  local_88.buffer[4] = '\0';
  local_88.buffer[5] = '\0';
  local_88.buffer[6] = '\0';
  local_88.buffer[7] = '\0';
  local_88.buffer[8] = '\0';
  local_88.buffer[9] = '\0';
  local_88.buffer[10] = '\0';
  local_88.buffer[0xb] = '\0';
  local_88.buffer[0xc] = '\0';
  local_88.buffer[0xd] = '\0';
  local_88.buffer[0xe] = '\0';
  local_88.buffer[0xf] = '\0';
  local_88.buf_used = 0;
  local_88._84_4_ = 0;
  __stream = fopen(filename,"wb");
  local_88.func = stbi__stdio_write;
  local_88.context = __stream;
  if (__stream == (FILE *)0x0) {
    _Var3 = false;
  }
  else {
    iVar2 = stbi_write_jpg_core(&local_88,iVar2,height,(int)puVar1,(void *)(ulong)(uint)quality,
                                in_R9D);
    fclose(__stream);
    _Var3 = iVar2 != 0;
  }
  plutovg_surface_write_end(surface);
  return _Var3;
}

Assistant:

bool plutovg_surface_write_to_jpg(const plutovg_surface_t* surface, const char* filename, int quality)
{
    plutovg_surface_write_begin(surface);
    int success = stbi_write_jpg(filename, surface->width, surface->height, 4, surface->data, quality);
    plutovg_surface_write_end(surface);
    return success;
}